

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

String __thiscall
testing::internal::XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes
          (XmlUnitTestResultPrinter *this,TestResult *result)

{
  EmptyTestEventListener EVar1;
  TestProperty *pTVar2;
  size_t sVar3;
  size_t extraout_RDX;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar5;
  ostream *poVar6;
  char *pcVar7;
  int i;
  String SVar8;
  XmlUnitTestResultPrinter local_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  char local_31;
  size_t sVar4;
  
  local_58.output_file_.length_ = (size_t)this;
  Message::Message((Message *)&local_40);
  if (0 < (int)((ulong)((long)(result->test_properties_).
                              super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_properties_).
                             super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
    i = 0;
    do {
      pTVar2 = TestResult::GetTestProperty(result,i);
      poVar6 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar6 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      pcVar7 = (pTVar2->key_).c_str_;
      if (pcVar7 == (char *)0x0) {
        sVar5.ptr_ = local_40.ptr_ + 0x10;
        sVar3 = 6;
        pcVar7 = "(null)";
      }
      else {
        sVar5.ptr_ = local_40.ptr_;
        if (local_40.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar5.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_40.ptr_ + 0x10);
        }
        sVar3 = strlen(pcVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar5.ptr_,pcVar7,sVar3);
      poVar6 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar6 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"=",1);
      poVar6 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar6 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
      EscapeXml(&local_58,(pTVar2->value_).c_str_,true);
      EVar1.super_TestEventListener._vptr_TestEventListener =
           (TestEventListener)(TestEventListener)local_58.super_EmptyTestEventListener;
      poVar6 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar6 = (ostream *)0x0;
      }
      if (local_58.super_EmptyTestEventListener.super_TestEventListener._vptr_TestEventListener ==
          (_func_int **)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(null)",6);
      }
      else if (local_58.output_file_.c_str_ != (char *)0x0) {
        pcVar7 = (char *)0x0;
        do {
          if (*(char *)((long)EVar1.super_TestEventListener._vptr_TestEventListener + (long)pcVar7)
              == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\\0",2);
          }
          else {
            local_31 = *(char *)((long)EVar1.super_TestEventListener._vptr_TestEventListener +
                                (long)pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_31,1);
          }
          pcVar7 = pcVar7 + 1;
        } while (pcVar7 != local_58.output_file_.c_str_);
      }
      poVar6 = (ostream *)(local_40.ptr_ + 0x10);
      if (local_40.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar6 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
      if (local_58.super_EmptyTestEventListener.super_TestEventListener._vptr_TestEventListener !=
          (_func_int **)0x0) {
        operator_delete__((void *)local_58.super_EmptyTestEventListener.super_TestEventListener.
                                  _vptr_TestEventListener);
      }
      i = i + 1;
    } while (i < (int)((ulong)((long)(result->test_properties_).
                                     super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(result->test_properties_).
                                    super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5));
  }
  SVar8 = StringStreamToString((internal *)local_58.output_file_.length_,local_40.ptr_);
  sVar4 = SVar8.length_;
  if (local_40.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_40.ptr_ + 8))();
    sVar4 = extraout_RDX;
  }
  SVar8.length_ = sVar4;
  SVar8.c_str_ = (char *)local_58.output_file_.length_;
  return SVar8;
}

Assistant:

String XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes(
    const TestResult& result) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << " " << property.key() << "="
        << "\"" << EscapeXmlAttribute(property.value()) << "\"";
  }
  return attributes.GetString();
}